

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

void VP8InitDithering(WebPDecoderOptions *options,VP8Decoder *dec)

{
  int iVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  int idx;
  VP8QuantMatrix *dqm;
  int all_amp;
  int s;
  int f;
  int max_amp;
  int d;
  float in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_38;
  uint local_24;
  int local_20;
  
  if (in_RDI != 0) {
    iVar1 = *(int *)(in_RDI + 0x2c);
    if (iVar1 < 0) {
      local_38 = 0;
    }
    else if (iVar1 < 0x65) {
      in_stack_ffffffffffffffc4 = (iVar1 * 0xff) / 100;
      local_38 = in_stack_ffffffffffffffc4;
    }
    else {
      in_stack_ffffffffffffffc4 = 0xff;
      local_38 = in_stack_ffffffffffffffc4;
    }
    if (0 < local_38) {
      local_24 = 0;
      for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
        lVar2 = in_RSI + 0x424 + (long)local_20 * 0x20;
        if (*(int *)(lVar2 + 0x18) < 0xc) {
          if (*(int *)(lVar2 + 0x18) < 0) {
            in_stack_ffffffffffffffc0 = 0;
          }
          else {
            in_stack_ffffffffffffffc0 = *(int *)(lVar2 + 0x18);
          }
          *(int *)(lVar2 + 0x1c) =
               (int)(local_38 *
                    (uint)"\b\a\x06\x04\x04\x02\x02\x02\x01\x01\x01\x01"[in_stack_ffffffffffffffc0])
               >> 3;
        }
        local_24 = *(uint *)(lVar2 + 0x1c) | local_24;
      }
      if (local_24 != 0) {
        VP8InitRandom((VP8Random *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
        *(undefined4 *)(in_RSI + 0x338) = 1;
      }
    }
    *(undefined4 *)(in_RSI + 0xbc8) = *(undefined4 *)(in_RDI + 0x34);
    if (*(int *)(in_RSI + 0xbc8) < 0x65) {
      if (*(int *)(in_RSI + 0xbc8) < 0) {
        *(undefined4 *)(in_RSI + 0xbc8) = 0;
      }
    }
    else {
      *(undefined4 *)(in_RSI + 0xbc8) = 100;
    }
  }
  return;
}

Assistant:

void VP8InitDithering(const WebPDecoderOptions* const options,
                      VP8Decoder* const dec) {
  assert(dec != NULL);
  if (options != NULL) {
    const int d = options->dithering_strength;
    const int max_amp = (1 << VP8_RANDOM_DITHER_FIX) - 1;
    const int f = (d < 0) ? 0 : (d > 100) ? max_amp : (d * max_amp / 100);
    if (f > 0) {
      int s;
      int all_amp = 0;
      for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
        VP8QuantMatrix* const dqm = &dec->dqm[s];
        if (dqm->uv_quant < DITHER_AMP_TAB_SIZE) {
          const int idx = (dqm->uv_quant < 0) ? 0 : dqm->uv_quant;
          dqm->dither = (f * kQuantToDitherAmp[idx]) >> 3;
        }
        all_amp |= dqm->dither;
      }
      if (all_amp != 0) {
        VP8InitRandom(&dec->dithering_rg, 1.0f);
        dec->dither = 1;
      }
    }
    // potentially allow alpha dithering
    dec->alpha_dithering = options->alpha_dithering_strength;
    if (dec->alpha_dithering > 100) {
      dec->alpha_dithering = 100;
    } else if (dec->alpha_dithering < 0) {
      dec->alpha_dithering = 0;
    }
  }
}